

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

FunctionRegistrator * anon_unknown.dwarf_1bd17c::FunctionRegistrator::instance(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::FunctionRegistrator::instance()::registrator == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::FunctionRegistrator::instance()::registrator
                               );
    if (iVar1 != 0) {
      FunctionRegistrator((FunctionRegistrator *)0x1f19a7);
      __cxa_atexit(~FunctionRegistrator,&instance::registrator,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::FunctionRegistrator::instance()::registrator);
    }
  }
  return &instance::registrator;
}

Assistant:

static FunctionRegistrator& instance()
        {
            static FunctionRegistrator registrator;
            return registrator;
        }